

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_> __thiscall
kj::anon_unknown_9::DiskHandle::tryOpenFile(DiskHandle *this,PathPtr path)

{
  size_t sVar1;
  int iVar2;
  int code;
  undefined4 extraout_var;
  undefined8 *puVar4;
  Disposer *extraout_RAX;
  Disposer *extraout_RAX_00;
  ReadableFile *extraout_RDX;
  ReadableFile *extraout_RDX_00;
  ReadableFile *extraout_RDX_01;
  ReadableFile *pRVar5;
  char *pcVar6;
  Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_> MVar7;
  Fault f;
  OwnFd local_5c;
  String local_58;
  PathPtr local_40;
  Disposer *pDVar3;
  
  local_40.parts.ptr = (String *)path.parts.size_;
  do {
    iVar2 = *(int *)&((path.parts.ptr)->content).ptr;
    PathPtr::toString(&local_58,&local_40,false);
    pcVar6 = "";
    if (local_58.content.size_ != 0) {
      pcVar6 = local_58.content.ptr;
    }
    iVar2 = openat64(iVar2,pcVar6,0x80000);
    sVar1 = local_58.content.size_;
    pcVar6 = local_58.content.ptr;
    if (local_58.content.ptr != (char *)0x0) {
      local_58.content.ptr = (char *)0x0;
      local_58.content.size_ = 0;
      (**(local_58.content.disposer)->_vptr_ArrayDisposer)
                (local_58.content.disposer,pcVar6,1,sVar1,sVar1,0);
    }
    if (-1 < iVar2) goto LAB_001eefd7;
    code = _::Debug::getOsErrorNumber(false);
    pDVar3 = (Disposer *)CONCAT44(extraout_var,code);
  } while (code == -1);
  if (code == 0) {
LAB_001eefd7:
    local_58.content.ptr = (char *)CONCAT44(local_58.content.ptr._4_4_,0xffffffff);
    local_5c.fd = iVar2;
    puVar4 = (undefined8 *)operator_new(0x10);
    *(int *)(puVar4 + 1) = iVar2;
    local_5c.fd = -1;
    *puVar4 = &PTR_getFd_00262368;
    *(undefined8 **)this = &_::HeapDisposer<kj::(anonymous_namespace)::DiskReadableFile>::instance;
    *(undefined8 **)(this + 2) = puVar4;
    OwnFd::~OwnFd(&local_5c);
    OwnFd::~OwnFd((OwnFd *)&local_58);
    pDVar3 = extraout_RAX;
    pRVar5 = extraout_RDX_00;
  }
  else if ((code == 0x14) || (code == 2)) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 2) = 0;
    pRVar5 = extraout_RDX;
  }
  else {
    _::Debug::Fault::Fault<int,kj::PathPtr&>
              ((Fault *)&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x302,code,"openat(fd, path, O_RDONLY)","path",&local_40);
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 2) = 0;
    _::Debug::Fault::~Fault((Fault *)&local_58);
    pDVar3 = extraout_RAX_00;
    pRVar5 = extraout_RDX_01;
  }
  MVar7.ptr.ptr = pRVar5;
  MVar7.ptr.disposer = pDVar3;
  return (Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_>)MVar7.ptr;
}

Assistant:

Maybe<Own<const ReadableFile>> tryOpenFile(PathPtr path) const {
    int newFd;
    KJ_SYSCALL_HANDLE_ERRORS(newFd = openat(
        fd, path.toString().cStr(), O_RDONLY | MAYBE_O_CLOEXEC)) {
      case ENOENT:
      case ENOTDIR:
        return kj::none;
      default:
        KJ_FAIL_SYSCALL("openat(fd, path, O_RDONLY)", error, path) { return kj::none; }
    }

    kj::OwnFd result(newFd);
#ifndef O_CLOEXEC
    setCloexec(result);
#endif

    return newDiskReadableFile(kj::mv(result));
  }